

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitArrayNewData
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          ArrayNewData *curr)

{
  Type *this_00;
  uint uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  DataSegment *pDVar4;
  size_type sVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  Literal local_170;
  uintptr_t local_158;
  HeapType heapType;
  undefined1 auStack_138 [8];
  Literals contents;
  undefined1 local_f8 [8];
  Flow offsetFlow;
  Flow sizeFlow;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_f8,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->offset);
  if (offsetFlow.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&offsetFlow.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->size);
    if (sizeFlow.breakTo.super_IString.str._M_len == 0) {
      if (((long)((long)offsetFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start -
                 offsetFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id)
          >> 3) * -0x5555555555555555 + (long)local_f8 != 1) {
LAB_00d2247d:
        __assert_fail("values.size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x52,"const Literal &wasm::Flow::getSingleValue()");
      }
      uVar2 = Literal::getUnsigned((Literal *)&offsetFlow);
      if (offsetFlow.breakTo.super_IString.str._M_str +
          ((long)((long)sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start -
                 sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
          3) * -0x5555555555555555 != (char *)0x1) goto LAB_00d2247d;
      uVar3 = Literal::getUnsigned((Literal *)&sizeFlow);
      this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)71>).super_Expression.type;
      local_158 = (uintptr_t)wasm::Type::getHeapType(this_00);
      HeapType::getArray((HeapType *)&sizeFlow.breakTo.super_IString.str._M_str);
      contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
      contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
      str._M_str = (char *)0x0;
      auStack_138 = (undefined1  [8])0x0;
      contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pDVar4 = Module::getDataSegment(this->wasm,(Name)(curr->segment).super_IString.str);
      uVar1 = Field::getByteSize((Field *)&sizeFlow.breakTo.super_IString.str._M_str);
      uVar7 = uVar1 * uVar3 + uVar2;
      if ((CARRY8(uVar1 * uVar3,uVar2)) ||
         ((ulong)((long)(pDVar4->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(pDVar4->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start) < uVar7)) {
        (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                  (this,"out of bounds segment access in array.new_data");
      }
      sVar5 = std::
              _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count(&(this->droppedDataSegments)._M_h,&curr->segment);
      if ((uVar7 != 0) && (sVar5 != 0)) {
        (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                  (this,"dropped segment access in array.new_data");
      }
      if (1 < uVar3) {
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::reserve
                  ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                   &contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type,uVar3 - 1)
        ;
      }
      uVar8 = (uint)uVar2;
      uVar6 = uVar2 & 0xffffffff;
      if (uVar6 < uVar7) {
        do {
          uVar8 = uVar8 + uVar1;
          ExpressionRunner<wasm::ModuleRunner>::makeFromMemory
                    (&local_170,&this->super_ExpressionRunner<wasm::ModuleRunner>,
                     (pDVar4->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar6,stack0xffffffffffffff98);
          SmallVector<wasm::Literal,_1UL>::push_back
                    ((SmallVector<wasm::Literal,_1UL> *)auStack_138,&local_170);
          Literal::~Literal(&local_170);
          uVar6 = (ulong)uVar8;
        } while (uVar6 < uVar7);
      }
      ExpressionRunner<wasm::ModuleRunner>::makeGCData
                ((Literal *)&heapType,&this->super_ExpressionRunner<wasm::ModuleRunner>,
                 (Literals *)auStack_138,(Type)this_00->id);
      Flow::Flow(__return_storage_ptr__,(Literal *)&heapType);
      Literal::~Literal((Literal *)&heapType);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      Literal::~Literal((Literal *)&contents);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)offsetFlow.breakTo.super_IString.str._M_str;
      Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                       _M_elems,(Literal *)&sizeFlow);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           (size_t)sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           (char *)sizeFlow.breakTo.super_IString.str._M_len;
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &sizeFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    Literal::~Literal((Literal *)&sizeFlow);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_f8;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,(Literal *)&offsetFlow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)offsetFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         offsetFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         offsetFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    offsetFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    offsetFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    offsetFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)offsetFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)offsetFlow.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &offsetFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&offsetFlow);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayNewData(ArrayNewData* curr) {
    NOTE_ENTER("ArrayNewData");
    auto offsetFlow = self()->visit(curr->offset);
    if (offsetFlow.breaking()) {
      return offsetFlow;
    }
    auto sizeFlow = self()->visit(curr->size);
    if (sizeFlow.breaking()) {
      return sizeFlow;
    }

    uint64_t offset = offsetFlow.getSingleValue().getUnsigned();
    uint64_t size = sizeFlow.getSingleValue().getUnsigned();

    auto heapType = curr->type.getHeapType();
    const auto& element = heapType.getArray().element;
    Literals contents;

    const auto& seg = *wasm.getDataSegment(curr->segment);
    auto elemBytes = element.getByteSize();

#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wmaybe-uninitialized"

    uint64_t end;
    if (std::ckd_add(&end, offset, size * elemBytes) || end > seg.data.size()) {
      trap("out of bounds segment access in array.new_data");
    }
    if (droppedDataSegments.count(curr->segment) && end > 0) {
      trap("dropped segment access in array.new_data");
    }
    contents.reserve(size);
    for (Index i = offset; i < end; i += elemBytes) {
      auto addr = (void*)&seg.data[i];
      contents.push_back(this->makeFromMemory(addr, element));
    }

#pragma GCC diagnostic pop

    return self()->makeGCData(std::move(contents), curr->type);
  }